

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int setjitmode(lua_State *L,int mode)

{
  uint uVar1;
  int iVar2;
  uint in_ESI;
  long in_RDI;
  int idx;
  int in_stack_00000040;
  int in_stack_00000044;
  lua_State *in_stack_00000048;
  int in_stack_ffffffffffffffe8;
  ErrMsg in_stack_ffffffffffffffec;
  undefined4 uVar3;
  
  uVar3 = 0;
  if ((*(long *)(in_RDI + 0x10) != *(long *)(in_RDI + 0x18)) &&
     (*(int *)(*(long *)(in_RDI + 0x10) + 4) != -1)) {
    if ((*(int *)(*(long *)(in_RDI + 0x10) + 4) == -9) ||
       (*(int *)(*(long *)(in_RDI + 0x10) + 4) == -8)) {
      uVar3 = 1;
    }
    else if (*(int *)(*(long *)(in_RDI + 0x10) + 4) != -3) goto LAB_0013771a;
    if ((*(long *)(in_RDI + 0x10) + 8U < *(ulong *)(in_RDI + 0x18)) &&
       ((*(int *)(*(long *)(in_RDI + 0x10) + 0xc) == -2 ||
        (*(int *)(*(long *)(in_RDI + 0x10) + 0xc) == -3)))) {
      uVar1 = 4;
      if (*(int *)(*(long *)(in_RDI + 0x10) + 0xc) != -2) {
        uVar1 = 3;
      }
      in_ESI = uVar1 | in_ESI;
    }
    else {
      in_ESI = in_ESI | 2;
    }
  }
  iVar2 = luaJIT_setmode(in_stack_00000048,in_stack_00000044,in_stack_00000040);
  if (iVar2 == 1) {
    return 0;
  }
  if ((in_ESI & 0xff) == 0) {
    lj_err_caller((lua_State *)CONCAT44(in_ESI,uVar3),in_stack_ffffffffffffffec);
  }
LAB_0013771a:
  lj_err_argt((lua_State *)CONCAT44(in_ESI,uVar3),in_stack_ffffffffffffffec,
              in_stack_ffffffffffffffe8);
}

Assistant:

static int setjitmode(lua_State *L, int mode)
{
  int idx = 0;
  if (L->base == L->top || tvisnil(L->base)) {  /* jit.on/off/flush([nil]) */
    mode |= LUAJIT_MODE_ENGINE;
  } else {
    /* jit.on/off/flush(func|proto, nil|true|false) */
    if (tvisfunc(L->base) || tvisproto(L->base))
      idx = 1;
    else if (!tvistrue(L->base))  /* jit.on/off/flush(true, nil|true|false) */
      goto err;
    if (L->base+1 < L->top && tvisbool(L->base+1))
      mode |= boolV(L->base+1) ? LUAJIT_MODE_ALLFUNC : LUAJIT_MODE_ALLSUBFUNC;
    else
      mode |= LUAJIT_MODE_FUNC;
  }
  if (luaJIT_setmode(L, idx, mode) != 1) {
    if ((mode & LUAJIT_MODE_MASK) == LUAJIT_MODE_ENGINE)
      lj_err_caller(L, LJ_ERR_NOJIT);
  err:
    lj_err_argt(L, 1, LUA_TFUNCTION);
  }
  return 0;
}